

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLowerGraph.h
# Opt level: O0

void __thiscall
InstructionRegVmLowerGraphContext::InstructionRegVmLowerGraphContext
          (InstructionRegVmLowerGraphContext *this,OutputContext *output)

{
  OutputContext *output_local;
  InstructionRegVmLowerGraphContext *this_local;
  
  this->output = output;
  this->code = (char *)0x0;
  this->lastStart = (char *)0x0;
  this->lastStartOffset = 0;
  this->lastEndOffset = 0;
  this->showSource = false;
  this->showAnnotatedSource = false;
  return;
}

Assistant:

InstructionRegVmLowerGraphContext(OutputContext &output): output(output)
	{
		code = 0;

		lastStart = 0;
		lastStartOffset = 0;
		lastEndOffset = 0;

		showSource = false;
		showAnnotatedSource = false;
	}